

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# insertOrReplace.hpp
# Opt level: O1

void __thiscall njoy::ENDFtk::tree::Material::insertOrReplace(Material *this,Section *section)

{
  _Rb_tree_header *p_Var1;
  int iVar2;
  File *this_00;
  _Base_ptr p_Var3;
  _Base_ptr p_Var4;
  int local_4c;
  File local_48;
  
  iVar2 = section->mf_;
  p_Var1 = &(this->files_)._M_t._M_impl.super__Rb_tree_header;
  p_Var4 = (this->files_)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
  p_Var3 = &p_Var1->_M_header;
  for (; p_Var4 != (_Base_ptr)0x0; p_Var4 = (&p_Var4->_M_left)[(int)p_Var4[1]._M_color < iVar2]) {
    if (iVar2 <= (int)p_Var4[1]._M_color) {
      p_Var3 = p_Var4;
    }
  }
  p_Var4 = &p_Var1->_M_header;
  if (((_Rb_tree_header *)p_Var3 != p_Var1) && (p_Var4 = p_Var3, iVar2 < (int)p_Var3[1]._M_color)) {
    p_Var4 = &p_Var1->_M_header;
  }
  if ((_Rb_tree_header *)p_Var4 == p_Var1) {
    local_48.mat_ = this->mat_;
    local_48.sections_._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
         &local_48.sections_._M_t._M_impl.super__Rb_tree_header._M_header;
    local_48.sections_._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    local_48.sections_._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    local_48.sections_._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
    local_4c = iVar2;
    local_48.mf_ = iVar2;
    local_48.sections_._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
         local_48.sections_._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    std::
    _Rb_tree<int,std::pair<int_const,njoy::ENDFtk::tree::File>,std::_Select1st<std::pair<int_const,njoy::ENDFtk::tree::File>>,std::less<int>,std::allocator<std::pair<int_const,njoy::ENDFtk::tree::File>>>
    ::_M_emplace_unique<int,njoy::ENDFtk::tree::File>
              ((_Rb_tree<int,std::pair<int_const,njoy::ENDFtk::tree::File>,std::_Select1st<std::pair<int_const,njoy::ENDFtk::tree::File>>,std::less<int>,std::allocator<std::pair<int_const,njoy::ENDFtk::tree::File>>>
                *)&this->files_,&local_4c,&local_48);
    std::
    _Rb_tree<int,_std::pair<const_int,_njoy::ENDFtk::tree::Section>,_std::_Select1st<std::pair<const_int,_njoy::ENDFtk::tree::Section>_>,_std::less<int>,_std::allocator<std::pair<const_int,_njoy::ENDFtk::tree::Section>_>_>
    ::~_Rb_tree(&local_48.sections_._M_t);
  }
  this_00 = file(this,section->mf_);
  File::insertOrReplace(this_00,section);
  return;
}

Assistant:

void insertOrReplace( Section&& section ) {

  if ( !this->hasMF( section.MF() ) ) {

    this->files_.emplace( section.MF(), File( this->MAT(), section.MF() ) );
  }

  this->MF( section.MF() ).insertOrReplace( std::move( section ) );
}